

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
SimulationDecPOMDPDiscrete::Step
          (SimulationDecPOMDPDiscrete *this,Index jaI,uint t,Index *sI,Index *joI,double *r,
          double *sumR,double specialR)

{
  DecPOMDPDiscreteInterface *pDVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  undefined1 auVar3 [16];
  Index IVar4;
  Index IVar5;
  ostream *poVar6;
  long *plVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pDVar1 = this->_m_pu->_m_DecPOMDP;
  IVar4 = (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8)) +
                      0x148))((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),*sI,jaI)
  ;
  pDVar1 = this->_m_pu->_m_DecPOMDP;
  IVar5 = (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8)) +
                      0x150))((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),jaI,
                              IVar4);
  *joI = IVar5;
  pDVar1 = this->_m_pu->_m_DecPOMDP;
  dVar8 = (double)(**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,*sI,jaI);
  *r = dVar8 + specialR;
  pDVar1 = this->_m_pu->_m_DecPOMDP;
  auVar11 = (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb0)) +
                        0x70))((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb0));
  auVar10._0_8_ = auVar11._8_8_;
  auVar10._8_56_ = extraout_var_00;
  auVar3 = vcvtusi2sd_avx512f(auVar10._0_16_,t);
  auVar9._0_8_ = pow(auVar11._0_8_,auVar3._0_8_);
  auVar9._8_56_ = extraout_var;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar8 + specialR;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *sumR;
  auVar3 = vfmadd213sd_fma(auVar9._0_16_,auVar11,auVar3);
  *sumR = auVar3._0_8_;
  if ((this->super_Simulation)._m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Simulation::RunSimulation (",0x1b);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") (",3);
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    plVar7 = (long *)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                           *(long *)(*(long *)pDVar1 + -0xb8)) + 0x38))
                               ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),*sI);
    (**(code **)(*plVar7 + 0x18))(&local_50,plVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
    plVar7 = (long *)(**(code **)((long)*pMVar2 + 0x80))(pMVar2,jaI);
    (**(code **)(*plVar7 + 0x20))(&local_70,plVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    plVar7 = (long *)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                           *(long *)(*(long *)pDVar1 + -0xb8)) + 0x38))
                               ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),IVar4)
    ;
    (**(code **)(*plVar7 + 0x18))(&local_90,plVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") (p ",5);
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    dVar8 = (double)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                          *(long *)(*(long *)pDVar1 + -0xb8)) + 0x108))
                              ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),*sI,jaI
                               ,IVar4);
    poVar6 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") jo ",5);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
    plVar7 = (long *)(**(code **)((long)*pMVar2 + 0xd8))(pMVar2,*joI);
    (**(code **)(*plVar7 + 0x20))(&local_b0,plVar7);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_b0,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (p ",4);
    pDVar1 = this->_m_pu->_m_DecPOMDP;
    dVar8 = (double)(**(code **)(*(long *)((long)&pDVar1->field_0x0 +
                                          *(long *)(*(long *)pDVar1 + -0xb8)) + 0x118))
                              ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),jaI,
                               IVar4,*joI);
    poVar6 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") r ",4);
    poVar6 = std::ostream::_M_insert<double>(*r);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," sumR ",6);
    poVar6 = std::ostream::_M_insert<double>(*sumR);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  *sI = IVar4;
  return;
}

Assistant:

void SimulationDecPOMDPDiscrete::Step(Index jaI, unsigned int t, Index &sI,
                                      Index &joI, double &r,
                                      double &sumR, double specialR) const
{
    Index sI_suc=_m_pu->GetDPOMDPD()->SampleSuccessorState(sI,jaI);

    joI=_m_pu->GetDPOMDPD()->SampleJointObservation(jaI,sI_suc);
    r = _m_pu->GetDPOMDPD()->GetReward(sI,jaI) + specialR;

    // calc. the discounted reward
    sumR+=r*pow(_m_pu->GetDiscount(),static_cast<double>(t));
    
    if(GetVerbose())
        cout << "Simulation::RunSimulation ("
             << sI << "," << jaI << "," << sI_suc << ") ("
             << (_m_pu->GetDPOMDPD()->GetState(sI)->SoftPrintBrief())
             << ","
             << (_m_pu->GetJointAction(jaI))->SoftPrintBrief()
             << ","
             << (_m_pu->GetDPOMDPD()->GetState(sI_suc)->SoftPrintBrief())
             << ") (p " 
             << _m_pu->GetDPOMDPD()->GetTransitionProbability(sI,jaI,sI_suc) 
             << ") jo " << joI << " "
             << (_m_pu->GetJointObservation(joI))->SoftPrintBrief()
             << " (p " 
             << _m_pu->GetDPOMDPD()->GetObservationProbability(jaI,sI_suc,joI)
             << ") r " << r << " sumR " << sumR << endl;

    sI = sI_suc;
}